

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O2

char * proto_token(char *proto)

{
  int iVar1;
  char **ppcVar2;
  
  ppcVar2 = built_in_protos;
  if (proto != (char *)0x0) {
    for (; *ppcVar2 != (char *)0x0; ppcVar2 = ppcVar2 + 1) {
      iVar1 = curl_strequal(*ppcVar2,proto);
      if (iVar1 != 0) {
        return *ppcVar2;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *proto_token(const char *proto)
{
  const char * const *builtin;

  if(!proto)
    return NULL;
  for(builtin = built_in_protos; *builtin; builtin++)
    if(curl_strequal(*builtin, proto))
      break;
  return *builtin;
}